

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O2

type llvm::hashing::detail::hash_combine_range_impl<unsigned_long_const>
               (unsigned_long *first,unsigned_long *last)

{
  uint64_t seed;
  type tVar1;
  ulong length;
  ulong uVar2;
  hash_state state;
  hash_state local_60;
  
  seed = get_execution_seed();
  length = (long)last - (long)first;
  if (length < 0x41) {
    tVar1.value = hash_short((char *)first,length,seed);
    return (type)tVar1.value;
  }
  uVar2 = length & 0xffffffffffffffc0;
  hash_state::create(&local_60,(char *)first,seed);
  while( true ) {
    uVar2 = uVar2 - 0x40;
    first = first + 8;
    if (uVar2 == 0) break;
    hash_state::mix(&local_60,(char *)first);
  }
  if ((length & 0x3f) != 0) {
    hash_state::mix(&local_60,(char *)(last + -8));
  }
  tVar1.value = hash_state::finalize(&local_60,length);
  return (type)tVar1.value;
}

Assistant:

typename std::enable_if<is_hashable_data<ValueT>::value, hash_code>::type
hash_combine_range_impl(ValueT *first, ValueT *last) {
  const uint64_t seed = get_execution_seed();
  const char *s_begin = reinterpret_cast<const char *>(first);
  const char *s_end = reinterpret_cast<const char *>(last);
  const size_t length = std::distance(s_begin, s_end);
  if (length <= 64)
    return hash_short(s_begin, length, seed);

  const char *s_aligned_end = s_begin + (length & ~63);
  hash_state state = state.create(s_begin, seed);
  s_begin += 64;
  while (s_begin != s_aligned_end) {
    state.mix(s_begin);
    s_begin += 64;
  }
  if (length & 63)
    state.mix(s_end - 64);

  return state.finalize(length);
}